

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall
H264StreamReader::getTSDescriptor
          (H264StreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  SPSUnit *this_00;
  uint8_t *end;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *buff;
  int iVar4;
  bool interlaced;
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  uint8_t video_format;
  SliceUnit slice;
  uint8_t local_ab;
  byte local_aa;
  uint8_t local_a9;
  double local_a8;
  SliceUnit local_a0;
  
  SliceUnit::SliceUnit(&local_a0);
  if (this->m_firstDecodeNal == true) {
    additionalStreamCheck
              (this,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
               (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    this->m_firstDecodeNal = false;
  }
  if (hdmvDescriptors) {
    dstBuff[0] = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    local_a8 = (this->super_MPEGStreamReader).m_fps;
    if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      uVar2 = 0;
      interlaced = true;
    }
    else {
      this_00 = (SPSUnit *)
                (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      uVar3 = this_00->pic_width_in_mbs;
      iVar4 = this_00->frame_mbs_only_flag;
      uVar2 = SPSUnit::getCropX(this_00);
      interlaced = iVar4 == 0;
      uVar2 = uVar3 * 0x10 - uVar2;
    }
    uVar3 = getStreamHeight(this);
    M2TSStreamInfo::blurayStreamParams
              (local_a8,interlaced,uVar2,uVar3,(this->super_MPEGStreamReader).m_streamAR,&local_a9,
               &local_aa,&local_ab);
    dstBuff[7] = (this->m_mvcSubStream != false) * '\x05' + '\x1b';
    dstBuff[8] = local_a9 << 4 | local_aa;
    dstBuff[9] = local_ab << 4 | 0xf;
    iVar4 = 10;
  }
  else {
    buff = NALUnit::findNextNAL
                     ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
                      (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    while( true ) {
      end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      if (end + -4 <= buff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/h264StreamReader.cpp"
                      ,0x1de,
                      "virtual int H264StreamReader::getTSDescriptor(uint8_t *, bool, const bool)");
      }
      if ((*buff & 0x17) == 7) break;
      buff = NALUnit::findNextNAL(buff,end);
    }
    processSPS(this,buff);
    dstBuff[0] = '(';
    dstBuff[1] = '\x04';
    dstBuff[2] = buff[1];
    dstBuff[3] = buff[2];
    bVar1 = this->m_forcedLevel;
    if (bVar1 == 0) {
      bVar1 = buff[3];
    }
    dstBuff[4] = bVar1;
    dstBuff[5] = 0xbf;
    iVar4 = 6;
  }
  local_a0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
  if (local_a0.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(local_a0.super_NALUnit.m_nalBuffer);
  }
  return iVar4;
}

Assistant:

int H264StreamReader::getTSDescriptor(uint8_t *dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    SliceUnit slice;
    if (m_firstDecodeNal)
    {
        additionalStreamCheck(m_buffer, m_bufEnd);
        m_firstDecodeNal = false;
    }

    if (hdmvDescriptors)
    {
        // Blu-ray core specifications Table 9-10 - HDMV_video_registration_descriptor
        *dstBuff++ = static_cast<int>(TSDescriptorTag::REGISTRATION);  // descriptor tag
        *dstBuff++ = 8;                                                // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;  // stuffing byte

        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);
        *dstBuff++ = !m_mvcSubStream ? static_cast<uint8_t>(StreamType::VIDEO_H264)
                                     : static_cast<uint8_t>(StreamType::VIDEO_MVC);  // stream_coding_type
        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);     // video_format + frame_rate
        *dstBuff = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);              // aspect ratio + stuffing_bits

        return 10;  // total descriptor length
    }

    // Not HDMV => AVC video descriptor according to H.222 Table 2-92
    // find SPS
    for (uint8_t *nal = NALUnit::findNextNAL(m_buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
    {
        const auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);
        if (nalType == NALUnit::NALType::nuSPS || nalType == NALUnit::NALType::nuSubSPS)
        {
            processSPS(nal);
            *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::AVC);   // descriptor tag
            *dstBuff++ = 4;                                            // descriptor length
            *dstBuff++ = nal[1];                                       // profile_idc
            *dstBuff++ = nal[2];                                       // constraint flags
            *dstBuff++ = m_forcedLevel == 0 ? nal[3] : m_forcedLevel;  // level_idc
            *dstBuff = 0xbf;  // AVC_still_present, AVC_24_hour flag, Frame_Packing_SEI_not_present_flag, reserved

            return 6;
        }
    }
    // avoid compiler warning: control reaches end of non-void function
    assert(0);  // no SPS nal: exit
    return 0;
}